

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O3

void fake_a_rnd(int min,int max,int column)

{
  long in_RAX;
  long stream;
  long N;
  long len;
  long local_18;
  
  stream = (long)column;
  local_18 = in_RAX;
  dss_random(&local_18,(long)min,(long)max,stream);
  N = (ulong)(local_18 != (local_18 / 5) * 5) + local_18 / 5;
  NthElement(N,&Seed[stream].usage);
  Seed[stream].nCalls = Seed[stream].nCalls + N;
  return;
}

Assistant:

void
fake_a_rnd(int min, int max, int column)
{
   DSS_HUGE len;
   DSS_HUGE itcount;

   RANDOM(len, min, max, column);
   if (len % 5L == 0)
      itcount = len/5;
   else 
	   itcount = len/5 + 1L;
   NthElement(itcount, &Seed[column].usage);
#ifdef RNG_TEST
	Seed[column].nCalls += itcount;
#endif
   return;
}